

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
function_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(function_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  int extraout_EAX;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *root;
  undefined4 in_register_00000034;
  value_type ref;
  error_code ec;
  result_options in_stack_000002bc;
  reference in_stack_000002c0;
  reference in_stack_000002c8;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000002d0;
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000002d8;
  error_code *in_stack_000002f0;
  error_code *in_stack_ffffffffffffff70;
  node_receiver_type *receiver;
  fd_set *current;
  path_node_type *last;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffa0;
  result_options in_stack_ffffffffffffffb0;
  error_code local_40;
  timeval *local_30;
  fd_set *local_28;
  path_node_type *local_20;
  fd_set *local_18;
  node_receiver_type *local_10;
  function_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_8;
  
  local_10 = (node_receiver_type *)CONCAT44(in_register_00000034,__nfds);
  local_30 = __timeout;
  local_28 = __exceptfds;
  local_20 = (path_node_type *)__writefds;
  local_18 = __readfds;
  local_8 = this;
  std::error_code::error_code(in_stack_ffffffffffffff70);
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
             in_stack_000002bc,in_stack_000002f0);
  bVar1 = std::error_code::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    receiver = local_10;
    current = local_18;
    last = local_20;
    root = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
           ::create_json<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
                     (in_stack_ffffffffffffffa0,
                      (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::tail_select((base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)in_stack_ffffffffffffffa0,
                  (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)this,root,last,(reference)current,receiver,in_stack_ffffffffffffffb0);
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x66d825);
  return extraout_EAX;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            std::error_code ec;
            value_type ref = expr_.evaluate(context, root, current, options, ec);
            if (!ec)
            {
                this->tail_select(context, root, last, *context.create_json(std::move(ref)), receiver, options);
            }
        }